

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  byte *pbVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  ushort uVar6;
  int iVar7;
  uchar *puVar8;
  int *piVar9;
  int line;
  uint uVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  byte bVar15;
  size_t sVar16;
  char *pcVar17;
  size_t sVar18;
  uchar *puVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 uVar25;
  undefined4 uVar27;
  ulong uVar26;
  uint local_40;
  
  uVar13 = (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 4;
  if (ssl->in_msglen < uVar13) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xbfe,"handshake message too short: %d");
    return -0x7200;
  }
  pbVar4 = ssl->in_msg;
  uVar13 = ((ulong)pbVar4[3] | (ulong)((uint)pbVar4[2] << 8 | (uint)pbVar4[1] << 0x10)) + uVar13;
  ssl->in_hslen = uVar13;
  uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(uint)*pbVar4);
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xc09,"handshake message: msglen = %d, type = %d, hslen = %d",ssl->in_msglen,uVar25,
             uVar13);
  if ((ssl->conf->field_0x164 & 2) == 0) {
    if (ssl->in_msglen < ssl->in_hslen) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xc47,"TLS handshake fragmentation not supported");
      return -0x7080;
    }
LAB_00138f53:
    if ((ssl->state != 0x10) && (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
      (*ssl->handshake->update_checksum)(ssl,ssl->in_msg,ssl->in_hslen);
    }
    if ((ssl->conf->field_0x164 & 2) != 0) {
      if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
        puVar3 = &ssl->handshake->in_msg_seq;
        *puVar3 = *puVar3 + 1;
        return 0;
      }
      return 0;
    }
    return 0;
  }
  pmVar5 = ssl->handshake;
  puVar8 = ssl->in_msg;
  if (pmVar5 != (mbedtls_ssl_handshake_params *)0x0) {
    uVar6 = *(ushort *)(puVar8 + 4) << 8 | *(ushort *)(puVar8 + 4) >> 8;
    if ((uint)uVar6 != pmVar5->in_msg_seq) {
      uVar27 = (undefined4)((ulong)uVar25 >> 0x20);
      if (((uint)uVar6 != pmVar5->in_flight_start_seq - 1) || (*puVar8 == '\x03')) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xc2b,"dropping out-of-sequence message: message_seq = %d, expected = %d",
                   (ulong)uVar6,CONCAT44(uVar27,pmVar5->in_msg_seq),uVar13);
        return -0x6900;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xc1e,"received message from last flight, message_seq = %d, start_of_flight = %d",
                 (ulong)uVar6,CONCAT44(uVar27,pmVar5->in_flight_start_seq),uVar13);
      iVar7 = mbedtls_ssl_resend(ssl);
      if (iVar7 == 0) {
        return -0x6900;
      }
      pcVar17 = "mbedtls_ssl_resend";
      line = 0xc22;
      goto LAB_00138c30;
    }
  }
  if ((((ssl->in_hslen <= ssl->in_msglen) && (iVar7 = bcmp(puVar8 + 6,"",3), iVar7 == 0)) &&
      (iVar7 = bcmp(puVar8 + 9,puVar8 + 1,3), iVar7 == 0)) &&
     ((pmVar5 == (mbedtls_ssl_handshake_params *)0x0 || (pmVar5->hs_msg == (uchar *)0x0))))
  goto LAB_00138f53;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xc39,"found fragmented DTLS handshake message");
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    pcVar17 = "not supported outside handshake (for now)";
    iVar7 = 0xb6d;
LAB_00138a8f:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,iVar7,pcVar17);
    iVar7 = -0x7080;
  }
  else {
    sVar18 = ssl->in_hslen;
    uVar1 = sVar18 - 0xc;
    piVar9 = (int *)ssl->handshake->hs_msg;
    if (piVar9 == (int *)0x0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xb79,"initialize reassembly, total length = %d",uVar1,uVar25,uVar13);
      if (0x4000 < ssl->in_hslen) {
        pcVar17 = "handshake message too large";
        iVar7 = 0xb7d;
        goto LAB_00138a8f;
      }
      sVar14 = ((uVar1 >> 3) + sVar18 + 1) - (ulong)((uVar1 & 7) == 0);
      puVar8 = (uchar *)calloc(1,sVar14);
      pmVar5 = ssl->handshake;
      pmVar5->hs_msg = puVar8;
      if (puVar8 != (uchar *)0x0) {
        puVar19 = ssl->in_msg;
        *(undefined2 *)(puVar8 + 4) = *(undefined2 *)(puVar19 + 4);
        *(undefined4 *)puVar8 = *(undefined4 *)puVar19;
        puVar8 = pmVar5->hs_msg;
        puVar8[8] = '\0';
        puVar8[6] = '\0';
        puVar8[7] = '\0';
        puVar8 = ssl->handshake->hs_msg;
        puVar8[0xb] = puVar8[3];
        *(undefined2 *)(puVar8 + 9) = *(undefined2 *)(puVar8 + 1);
        piVar11 = (int *)ssl->in_msg;
        piVar9 = (int *)ssl->handshake->hs_msg;
        goto LAB_00138b78;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xb87,"alloc failed (%d bytes)",sVar14);
      iVar7 = -0x7f00;
    }
    else {
      piVar11 = (int *)ssl->in_msg;
      if (*piVar9 == *piVar11) {
LAB_00138b78:
        bVar21 = *(byte *)(piVar11 + 2);
        uVar23 = (ulong)((uint)*(byte *)((long)piVar11 + 7) << 8 |
                        (uint)*(byte *)((long)piVar11 + 6) << 0x10) | (ulong)bVar21;
        uVar22 = (uint)*(byte *)((long)piVar11 + 10) << 8 |
                 (uint)*(byte *)((long)piVar11 + 9) << 0x10;
        bVar15 = *(byte *)((long)piVar11 + 0xb);
        sVar14 = (ulong)bVar15 + (ulong)uVar22;
        if (uVar1 < sVar14 + uVar23) {
          pcVar17 = "invalid fragment offset/len: %d + %d > %d";
          iVar7 = 0xbac;
          uVar26 = sVar14;
          uVar13 = uVar1;
        }
        else {
          uVar2 = sVar14 + 0xc;
          uVar26 = ssl->in_msglen;
          if (uVar2 <= uVar26) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,3000,"adding fragment, offset = %d, length = %d",uVar23,sVar14,uVar13);
            memcpy((void *)((long)piVar9 + uVar23 + 0xc),ssl->in_msg + 0xc,sVar14);
            bVar21 = bVar21 & 7;
            if (bVar21 == 0) {
LAB_00138d68:
              if ((sVar14 & 7) != 0) {
                uVar13 = uVar23 + sVar14 >> 3;
                bVar21 = *(byte *)((long)piVar9 + uVar13 + sVar18);
                for (iVar7 = 8 - ((uint)sVar14 & 7); iVar7 != 8; iVar7 = iVar7 + 1) {
                  bVar21 = bVar21 | (byte)(1 << ((byte)iVar7 & 0x1f));
                }
                *(byte *)((long)piVar9 + uVar13 + sVar18) = bVar21;
              }
              memset((void *)((long)piVar9 + (uVar23 >> 3) + sVar18),0xff,sVar14 >> 3);
            }
            else {
              bVar21 = 8 - bVar21;
              uVar13 = uVar23 >> 3;
              uVar20 = (uint)sVar14;
              uVar10 = (uint)bVar21;
              if (uVar20 < bVar21 || uVar20 == uVar10) {
                local_40 = (uint)bVar15;
                iVar7 = uVar10 - (uVar22 + local_40);
                sVar16 = sVar14;
                while (bVar24 = sVar16 != 0, sVar16 = sVar16 - 1, sVar14 = 0, bVar24) {
                  pbVar4 = (byte *)((long)piVar9 + uVar13 + sVar18);
                  *pbVar4 = *pbVar4 | (byte)(1 << ((byte)iVar7 & 0x1f));
                  iVar7 = iVar7 + 1;
                }
              }
              else {
                bVar15 = *(byte *)((long)piVar9 + uVar13 + sVar18);
                while (uVar10 = uVar10 - 1, uVar10 != 0xffffffff) {
                  bVar15 = bVar15 | (byte)(1 << ((byte)uVar10 & 0x1f));
                }
                uVar23 = uVar23 + bVar21;
                *(byte *)((long)piVar9 + uVar13 + sVar18) = bVar15;
                sVar14 = sVar14 - bVar21;
              }
              if (bVar21 < uVar20) goto LAB_00138d68;
            }
            uVar13 = 0;
            do {
              if (uVar1 >> 3 == uVar13) {
                lVar12 = 0;
                goto LAB_00138dd3;
              }
              lVar12 = uVar13 + sVar18;
              uVar13 = uVar13 + 1;
            } while (*(char *)((long)piVar9 + lVar12) == -1);
            goto LAB_00138dec;
          }
          pcVar17 = "invalid fragment length: %d + 12 > %d";
          iVar7 = 0xbb3;
          uVar23 = sVar14;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,iVar7,pcVar17,uVar23,uVar26,uVar13);
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xb97,"fragment header mismatch");
      }
      iVar7 = -0x7200;
    }
  }
  goto LAB_00138c17;
  while (iVar7 = (int)lVar12, lVar12 = lVar12 + -1,
        (*(byte *)((long)piVar9 + (uVar1 >> 3) + sVar18) >> (iVar7 + 7U & 0x1f) & 1) != 0) {
LAB_00138dd3:
    if (-lVar12 == (ulong)((uint)uVar1 & 7)) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xbc7,"handshake message completed");
      if (uVar2 < ssl->in_msglen) {
        pcVar17 = "last fragment not alone in its record";
        iVar7 = 0xbd0;
        goto LAB_00138a8f;
      }
      uVar13 = ssl->next_record_offset;
      sVar14 = ssl->in_left - uVar13;
      if (uVar13 <= ssl->in_left && sVar14 != 0) {
        puVar8 = ssl->in_hdr;
        sVar18 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar8;
        ssl->next_record_offset = sVar18;
        puVar19 = (uchar *)(sVar18 + sVar14);
        ssl->in_left = (size_t)puVar19;
        if (ssl->in_buf + (0x414d - (long)puVar8) < puVar19) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0xbe6,"reassembled message too large for buffer");
          iVar7 = -0x6a00;
          goto LAB_00138c17;
        }
        memmove(ssl->in_msg + ssl->in_hslen,puVar8 + uVar13,sVar14);
      }
      memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
      free(ssl->handshake->hs_msg);
      ssl->handshake->hs_msg = (uchar *)0x0;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xbf3,"reassembled handshake message",ssl->in_msg,ssl->in_hslen);
      goto LAB_00138f53;
    }
  }
LAB_00138dec:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xbc3,"message is not complete yet");
  iVar7 = -0x6900;
LAB_00138c17:
  pcVar17 = "ssl_reassemble_dtls_handshake";
  line = 0xc3d;
LAB_00138c30:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,line,pcVar17,iVar7);
  return iVar7;
}

Assistant:

static int ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        /* ssl->handshake is NULL when receiving ClientHello for renego */
        if( ssl->handshake != NULL &&
            recv_msg_seq != ssl->handshake->in_msg_seq )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_WANT_READ );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER &&
        ssl->handshake != NULL )
    {
        ssl->handshake->update_checksum( ssl, ssl->in_msg, ssl->in_hslen );
    }

    /* Handshake message is complete, increment counter */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL )
    {
        ssl->handshake->in_msg_seq++;
    }
#endif

    return( 0 );
}